

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

Integer __thiscall
nvim::Nvim::buf_set_virtual_text
          (Nvim *this,Buffer buffer,Integer ns_id,Integer line,Array *chunks,Dictionary *opts)

{
  allocator local_61;
  string local_60;
  Integer local_40;
  Integer res;
  Dictionary *opts_local;
  Array *chunks_local;
  Integer line_local;
  Integer ns_id_local;
  Buffer buffer_local;
  Nvim *this_local;
  
  res = (Integer)opts;
  opts_local = (Dictionary *)chunks;
  chunks_local = (Array *)line;
  line_local = ns_id;
  ns_id_local = buffer;
  buffer_local = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"nvim_buf_set_virtual_text",&local_61);
  NvimRPC::
  call<long,long,long,std::vector<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::allocator<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_60,&local_40,&ns_id_local,&line_local,(long *)&chunks_local,
             (vector<msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_std::allocator<msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>_>
              *)opts_local,
             (multimap<msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_std::less<msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>,_std::allocator<std::pair<const_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>_>_>
              *)res);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return local_40;
}

Assistant:

Integer Nvim::buf_set_virtual_text(Buffer buffer, Integer ns_id, Integer line, const Array& chunks, const Dictionary& opts) {
    Integer res;
    client_.call("nvim_buf_set_virtual_text", res, buffer, ns_id, line, chunks, opts);
    return res;
}